

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

error_or_n<int,_byte_span> * __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::get_span_impl(error_or_n<int,_byte_span> *__return_storage_ptr__,
               buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
               *this,int io,byte_span *sp)

{
  maybe<unsigned_char,_void> *this_00;
  iterator *other;
  uchar uVar1;
  span<unsigned_char,__1L> *psVar2;
  pointer peVar3;
  bool bVar4;
  bool bVar5;
  uchar *puVar6;
  reference peVar7;
  extent_type<_1L> eVar8;
  tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
  *ptVar9;
  difference_type dVar10;
  error_code eVar11;
  error_code erc;
  int io_local;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_c8;
  error_or_n<int,_byte_span> *local_b0;
  span<unsigned_char,__1L> *local_a8;
  span<unsigned_char,__1L> *local_a0;
  span<unsigned_char,__1L> local_98;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *local_88;
  error_or_n<int,_gsl::span<std::uint8_t>::iterator> x;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  
  eVar8.size_ = (sp->storage_).super_extent_type<_1L>.size_;
  local_c8 = sp->storage_;
  io_local = io;
  local_b0 = __return_storage_ptr__;
  local_a8 = sp;
  if (((this->push_).valid_ == true) && (0 < (sp->storage_).super_extent_type<_1L>.size_)) {
    this_00 = &this->push_;
    puVar6 = maybe<unsigned_char,_void>::operator->(this_00);
    uVar1 = *puVar6;
    peVar7 = pstore::gsl::span<unsigned_char,_-1L>::operator[](local_a8,0);
    *peVar7 = uVar1;
    if (this_00->valid_ == true) {
      this_00->valid_ = false;
    }
    local_c8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_c8,1,-1);
    eVar8 = local_c8.super_extent_type<_1L>.size_;
  }
  other = &this->pos_;
  local_88 = &this->end_;
  local_a0 = &this->span_;
  do {
    if ((eVar8.size_ == 0) || (this->is_eof_ != false)) {
      peVar3 = (local_a8->storage_).data_;
      pstore::gsl::details::extent_type<-1L>::extent_type
                ((extent_type<_1L> *)&x,(long)local_c8.data_ - (long)peVar3);
      x.field_0._8_8_ = peVar3;
      error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
      error_or<int&,pstore::gsl::span<unsigned_char,_1l>>
                ((error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>> *)local_b0,
                 &io_local,&x);
      return local_b0;
    }
    if (((this->pos_).span_ == (this->end_).span_) && ((this->pos_).index_ == (this->end_).index_))
    {
      std::
      function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
      ::operator()(&x,&this->refill_,io_local,local_a0);
      if (x.has_error_ == true) {
        eVar11 = error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                 ::get_error(&x);
        erc._M_cat = eVar11._M_cat;
        erc._4_4_ = 0;
        erc._M_value = eVar11._M_value;
        error_or<std::tuple<int,_pstore::gsl::span<unsigned_char,_-1L>_>_>::error_or(local_b0,erc);
        error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
        ::~error_or(&x);
        return local_b0;
      }
      ptVar9 = error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
               ::
               value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                         (&x);
      io_local = (ptVar9->
                 super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                 ).super__Head_base<0UL,_int,_false>._M_head_impl;
      ptVar9 = error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
               ::
               value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                         (&x);
      pstore::gsl::span<unsigned_char,_-1L>::begin(&local_98);
      psVar2 = (ptVar9->
               super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
               ).
               super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
               .
               super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
               ._M_head_impl.span_;
      peVar3 = (pointer)(ptVar9->
                        super__Tuple_impl<0UL,_int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                        ).
                        super__Tuple_impl<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                        .
                        super__Head_base<1UL,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>,_false>
                        ._M_head_impl.index_;
      bVar4 = local_98.storage_.data_ == peVar3;
      bVar5 = (span<unsigned_char,__1L> *)local_98.storage_.super_extent_type<_1L>.size_ == psVar2;
      if (bVar4 && bVar5) {
        this->is_eof_ = true;
        peVar3 = (local_a8->storage_).data_;
        pstore::gsl::details::extent_type<-1L>::extent_type
                  ((extent_type<_1L> *)&local_98,(long)local_c8.data_ - (long)peVar3);
        local_98.storage_.data_ = peVar3;
        error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
        error_or<int&,pstore::gsl::span<unsigned_char,_1l>>
                  ((error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>> *)local_b0,
                   &io_local,&local_98);
      }
      else {
        (this->end_).span_ = psVar2;
        (this->end_).index_ = (ptrdiff_t)peVar3;
        pstore::gsl::span<unsigned_char,_-1L>::begin(&local_98);
        (this->pos_).span_ =
             (span<unsigned_char,__1L> *)local_98.storage_.super_extent_type<_1L>.size_;
        (this->pos_).index_ = (ptrdiff_t)local_98.storage_.data_;
      }
      error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
      ::~error_or(&x);
      if (bVar4 && bVar5) {
        return local_b0;
      }
    }
    check_invariants(this);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_60,other);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_40,local_88);
    dVar10 = std::
             distance<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>
                       (&local_60,&local_40);
    eVar8.size_ = local_c8.super_extent_type<_1L>.size_;
    if (dVar10 <= local_c8.super_extent_type<_1L>.size_) {
      eVar8.size_ = dVar10;
    }
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_50,other);
    std::
    copy_n<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,long,unsigned_char*>
              (&local_50,eVar8.size_,local_c8.data_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
              (other,eVar8.size_);
    local_c8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_c8,eVar8.size_,-1);
    eVar8 = local_c8.super_extent_type<_1L>.size_;
  } while( true );
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }